

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

void __thiscall Fl_Browser_::swapping(Fl_Browser_ *this,void *a,void *b)

{
  void *b_local;
  void *a_local;
  Fl_Browser_ *this_local;
  
  redraw_line(this,a);
  redraw_line(this,b);
  if (a == this->selection_) {
    this->selection_ = b;
  }
  else if (b == this->selection_) {
    this->selection_ = a;
  }
  if (a == this->top_) {
    this->top_ = b;
  }
  else if (b == this->top_) {
    this->top_ = a;
  }
  return;
}

Assistant:

void Fl_Browser_::swapping(void* a, void* b) {
  redraw_line(a);
  redraw_line(b);
  if (a == selection_) selection_ = b;
  else if (b == selection_) selection_ = a;
  if (a == top_) top_ = b;
  else if (b == top_) top_ = a;
}